

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

int32 bio_fread(void *buf,int32 el_sz,int32 n_el,FILE *fp,int32 swap,uint32 *chksum)

{
  uint32 uVar1;
  size_t sVar2;
  uint32 *chksum_local;
  int32 swap_local;
  FILE *fp_local;
  int32 n_el_local;
  int32 el_sz_local;
  void *buf_local;
  
  sVar2 = fread(buf,(long)el_sz,(long)n_el,(FILE *)fp);
  if (sVar2 == (long)n_el) {
    if (swap != 0) {
      swap_buf(buf,el_sz,n_el);
    }
    buf_local._4_4_ = n_el;
    if (chksum != (uint32 *)0x0) {
      uVar1 = chksum_accum(buf,el_sz,n_el,*chksum);
      *chksum = uVar1;
    }
  }
  else {
    buf_local._4_4_ = -1;
  }
  return buf_local._4_4_;
}

Assistant:

int32
bio_fread(void *buf, int32 el_sz, int32 n_el, FILE * fp, int32 swap,
          uint32 * chksum)
{
    if (fread(buf, el_sz, n_el, fp) != (size_t) n_el)
        return -1;

    if (swap)
        swap_buf(buf, el_sz, n_el);

    if (chksum)
        *chksum = chksum_accum(buf, el_sz, n_el, *chksum);

    return n_el;
}